

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nes_Oscs.cpp
# Opt level: O0

void __thiscall Nes_Triangle::run(Nes_Triangle *this,nes_time_t time,nes_time_t end_time)

{
  int iVar1;
  nes_time_t nVar2;
  int iVar3;
  int in_EDX;
  int in_ESI;
  Nes_Triangle *in_RDI;
  int volume;
  int phase;
  Blip_Buffer *output;
  int delta;
  int timer_period;
  int in_stack_ffffffffffffffc8;
  blip_time_t in_stack_ffffffffffffffcc;
  int local_28;
  int local_24;
  int local_c;
  
  iVar1 = Nes_Osc::period(&in_RDI->super_Nes_Osc);
  iVar1 = iVar1 + 1;
  if ((in_RDI->super_Nes_Osc).output == (Blip_Buffer *)0x0) {
    iVar3 = (in_RDI->super_Nes_Osc).delay;
    (in_RDI->super_Nes_Osc).delay = 0;
    if ((((in_RDI->super_Nes_Osc).length_counter != 0) && (in_RDI->linear_counter != 0)) &&
       (2 < iVar1)) {
      nVar2 = maintain_phase(in_RDI,iVar3 + in_ESI,in_EDX,iVar1);
      (in_RDI->super_Nes_Osc).delay = nVar2 - in_EDX;
    }
  }
  else {
    Blip_Buffer::set_modified((in_RDI->super_Nes_Osc).output);
    iVar3 = calc_amp(in_RDI);
    iVar3 = Nes_Osc::update_amp(&in_RDI->super_Nes_Osc,iVar3);
    if (iVar3 != 0) {
      Blip_Synth<8,_1>::offset
                ((Blip_Synth<8,_1> *)in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                 (Blip_Buffer *)0x988179);
    }
    local_c = (in_RDI->super_Nes_Osc).delay + in_ESI;
    iVar3 = in_EDX;
    if (((((in_RDI->super_Nes_Osc).length_counter != 0) &&
         (iVar3 = in_EDX, in_RDI->linear_counter != 0)) && (iVar3 = in_EDX, 2 < iVar1)) &&
       (iVar3 = local_c, local_c < in_EDX)) {
      local_24 = in_RDI->phase;
      local_28 = 1;
      if (0x10 < local_24) {
        local_24 = local_24 + -0x10;
        local_28 = -1;
      }
      do {
        local_24 = local_24 + -1;
        if (local_24 == 0) {
          local_24 = 0x10;
          local_28 = -local_28;
        }
        else {
          Blip_Synth<8,_1>::offset_inline
                    ((Blip_Synth<8,_1> *)in_RDI,in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8,
                     (Blip_Buffer *)0x988236);
        }
        local_c = iVar1 + local_c;
      } while (local_c < in_EDX);
      if (local_28 < 0) {
        local_24 = local_24 + 0x10;
      }
      in_RDI->phase = local_24;
      iVar1 = calc_amp(in_RDI);
      (in_RDI->super_Nes_Osc).last_amp = iVar1;
      iVar3 = local_c;
    }
    local_c = iVar3;
    (in_RDI->super_Nes_Osc).delay = local_c - in_EDX;
  }
  return;
}

Assistant:

void Nes_Triangle::run( nes_time_t time, nes_time_t end_time )
{
	const int timer_period = period() + 1;
	if ( !output )
	{
		time += delay;
		delay = 0;
		if ( length_counter && linear_counter && timer_period >= 3 )
			delay = maintain_phase( time, end_time, timer_period ) - end_time;
		return;
	}
	
	output->set_modified();
	
	// to do: track phase when period < 3
	// to do: Output 7.5 on dac when period < 2? More accurate, but results in more clicks.
	
	int delta = update_amp( calc_amp() );
	if ( delta )
		synth.offset( time, delta, output );
	
	time += delay;
	if ( length_counter == 0 || linear_counter == 0 || timer_period < 3 )
	{
		time = end_time;
	}
	else if ( time < end_time )
	{
		Blip_Buffer* const output = this->output;
		
		int phase = this->phase;
		int volume = 1;
		if ( phase > phase_range ) {
			phase -= phase_range;
			volume = -volume;
		}
		
		do {
			if ( --phase == 0 ) {
				phase = phase_range;
				volume = -volume;
			}
			else {
				synth.offset_inline( time, volume, output );
			}
			
			time += timer_period;
		}
		while ( time < end_time );
		
		if ( volume < 0 )
			phase += phase_range;
		this->phase = phase;
		last_amp = calc_amp();
 	}
	delay = time - end_time;
}